

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void ConnCloseHandler(CManager cm,CMConnection conn,void *client_data)

{
  key_type *__k;
  AnonADIOSFile *this;
  mapped_type pAVar1;
  mapped_type *ppAVar2;
  ostream *poVar3;
  mapped_type *ppAVar4;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> extraout_RDX;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> extraout_RDX_00;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> _Var6;
  _Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> __tmp;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> _Var7;
  pair<std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>,_std::__detail::_Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false>_>
  pVar8;
  string local_50;
  _Node_iterator<std::pair<void_*const,_unsigned_long>,_false,_false> _Var5;
  
  local_50._M_dataplus._M_p = (pointer)conn;
  pVar8 = std::
          _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&ConnToFileMap._M_h,(key_type *)&local_50);
  _Var5 = pVar8.second.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>.
          _M_cur;
  while( true ) {
    _Var7._M_cur = (__node_type *)
                   pVar8.first.
                   super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur;
    if ((_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>)_Var7._M_cur ==
        _Var5.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur) break;
    __k = (key_type *)
          (((_Var7._M_cur)->super__Hash_node_value<std::pair<void_*const,_unsigned_long>,_false>).
           super__Hash_node_value_base<std::pair<void_*const,_unsigned_long>_>._M_storage._M_storage
           .__data + 8);
    ppAVar2 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&ADIOSFileMap,__k);
    this = *ppAVar2;
    if (this != (AnonADIOSFile *)0x0) {
      if (0 < verbose) {
        poVar3 = std::operator<<((ostream *)&std::cout,"closing ADIOS file \"");
        poVar3 = std::operator<<(poVar3,(string *)&this->m_FileName);
        poVar3 = std::operator<<(poVar3,"\" total sent ");
        readable_size_abi_cxx11_(&local_50,this->m_BytesSent);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        poVar3 = std::operator<<(poVar3," in ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," Get()s");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_AnonADIOSFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonADIOSFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&ADIOSFileMap._M_h,__k);
      AnonADIOSFile::~AnonADIOSFile(this);
      operator_delete(this);
    }
    ppAVar4 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&SimpleFileMap,__k);
    pAVar1 = *ppAVar4;
    _Var6._M_cur = extraout_RDX._M_cur;
    if (pAVar1 != (mapped_type)0x0) {
      if (0 < verbose) {
        poVar3 = std::operator<<((ostream *)&std::cout,"closing simple file ");
        poVar3 = std::operator<<(poVar3,(string *)&pAVar1->m_FileName);
        poVar3 = std::operator<<(poVar3,"\" total sent ");
        readable_size_abi_cxx11_(&local_50,pAVar1->m_BytesSent);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        poVar3 = std::operator<<(poVar3," in ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," Read()s");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_AnonSimpleFile_*>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&SimpleFileMap._M_h,__k);
      if (this != (AnonADIOSFile *)0x0) {
        AnonADIOSFile::~AnonADIOSFile(this);
      }
      operator_delete(this);
      _Var6._M_cur = extraout_RDX_00._M_cur;
    }
    pVar8.second.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur =
         (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>)
         (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>)_Var6._M_cur;
    pVar8.first.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur =
         (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>)
         (_Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>)
         ((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
  }
  local_50._M_dataplus._M_p = (pointer)conn;
  std::
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::_M_erase(&ConnToFileMap._M_h);
  return;
}

Assistant:

static void ConnCloseHandler(CManager cm, CMConnection conn, void *client_data)
{
    auto it = ConnToFileMap.equal_range(conn);
    for (auto it1 = it.first; it1 != it.second; it1++)
    {
        AnonADIOSFile *file = ADIOSFileMap[it1->second];
        if (file)
        {
            if (verbose >= 1)
                std::cout << "closing ADIOS file \"" << file->m_FileName << "\" total sent "
                          << readable_size(file->m_BytesSent) << " in " << file->m_OperationCount
                          << " Get()s" << std::endl;
            ADIOSFileMap.erase(it1->second);
            delete file;
        }
        AnonSimpleFile *sfile = SimpleFileMap[it1->second];
        if (sfile)
        {
            if (verbose >= 1)
                std::cout << "closing simple file " << sfile->m_FileName << "\" total sent "
                          << readable_size(sfile->m_BytesSent) << " in " << sfile->m_OperationCount
                          << " Read()s" << std::endl;
            SimpleFileMap.erase(it1->second);
            delete file;
        }
    }
    ConnToFileMap.erase(conn);
}